

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O0

void uhash_setResizePolicy_63(UHashtable *hash,UHashResizePolicy policy)

{
  UErrorCode local_18;
  UHashResizePolicy local_14;
  UErrorCode status;
  UHashResizePolicy policy_local;
  UHashtable *hash_local;
  
  local_18 = U_ZERO_ERROR;
  local_14 = policy;
  _status = hash;
  _uhash_internalSetResizePolicy(hash,policy);
  _status->lowWaterMark = (int)((float)_status->length * _status->lowWaterRatio);
  _status->highWaterMark = (int)((float)_status->length * _status->highWaterRatio);
  _uhash_rehash(_status,&local_18);
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uhash_setResizePolicy(UHashtable *hash, enum UHashResizePolicy policy) {
    UErrorCode status = U_ZERO_ERROR;
    _uhash_internalSetResizePolicy(hash, policy);
    hash->lowWaterMark  = (int32_t)(hash->length * hash->lowWaterRatio);
    hash->highWaterMark = (int32_t)(hash->length * hash->highWaterRatio);
    _uhash_rehash(hash, &status);
}